

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O0

void helicsFederateEnterExecutingModeIterativeAsync
               (HelicsFederate fed,HelicsIterationRequest iterate,HelicsError *err)

{
  Federate *pFVar1;
  HelicsIterationRequest in_ESI;
  Federate *fedObj;
  IterationRequest in_stack_0000008f;
  Federate *in_stack_00000090;
  HelicsError *in_stack_ffffffffffffffd8;
  HelicsFederate in_stack_ffffffffffffffe0;
  
  pFVar1 = getFed(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (pFVar1 != (Federate *)0x0) {
    anon_unknown.dwarf_4e9a2::getIterationRequest(in_ESI);
    helics::Federate::enterExecutingModeAsync(in_stack_00000090,in_stack_0000008f);
  }
  return;
}

Assistant:

void helicsFederateEnterExecutingModeIterativeAsync(HelicsFederate fed, HelicsIterationRequest iterate, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterExecutingModeAsync(getIterationRequest(iterate));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}